

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall
CRegexParser::get_match_length
          (CRegexParser *this,re_state_id init,re_state_id final,int *minlen,int *maxlen,
          regex_scan_frame *stack)

{
  wchar_t wVar1;
  re_tuple *prVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int final_00;
  uint uVar7;
  int init_00;
  anon_union_16_5_eb0a944d_for_info *paVar8;
  long lStack_70;
  int gmax;
  int gmin;
  uint *local_58;
  uint *local_50;
  regex_scan_frame local_48;
  int max1;
  int max2;
  
  *maxlen = 0;
  *minlen = 0;
  lVar3 = 0x18;
  local_58 = (uint *)maxlen;
  local_50 = (uint *)minlen;
  local_48.parent = stack;
  do {
    if (init == final) {
      return;
    }
    prVar2 = this->tuple_arr_;
    prVar2[init].flags = prVar2[init].flags | 8;
    lStack_70 = lVar3;
    local_48.st = init;
    switch(prVar2[init].typ) {
    case RE_EPSILON:
      if (prVar2[init].next_state_2 != -1) {
        iVar4 = regex_scan_frame::is_recursing(&local_48);
        if (iVar4 != 0) {
          *local_58 = 0xffffffff;
          return;
        }
        get_match_length(this,prVar2[init].next_state_1,final,&gmin,&max1,&local_48);
        get_match_length(this,prVar2[init].next_state_2,final,&gmax,&max2,&local_48);
        uVar5 = gmax;
        if ((uint)gmin < (uint)gmax) {
          uVar5 = gmin;
        }
        if (gmax < 0) {
          uVar5 = gmin;
        }
        if (gmin < 0) {
          uVar5 = gmax;
        }
        uVar7 = uVar5 + *local_50;
        if ((int)(uVar5 | *local_50) < 0) {
          uVar7 = 0xffffffff;
        }
        *local_50 = uVar7;
        uVar5 = max2;
        if (max2 < max1) {
          uVar5 = max1;
        }
        if ((max2 | max1) < 0) {
          uVar5 = 0xffffffff;
        }
        uVar7 = uVar5 + *local_58;
        if ((int)(uVar5 | *local_58) < 0) {
          uVar7 = 0xffffffff;
        }
        *local_58 = uVar7;
        return;
      }
      break;
    default:
      uVar5 = *local_50 + 1;
      if ((int)*local_50 < 0) {
        uVar5 = 0xffffffff;
      }
      *local_50 = uVar5;
      uVar5 = *local_58 + 1;
      if ((int)*local_58 < 0) {
        uVar5 = 0xffffffff;
      }
      *local_58 = uVar5;
      break;
    case RE_TEXT_BEGIN:
    case RE_TEXT_END:
    case RE_LOOKBACK_POS:
    case RE_WORD_BEGIN:
    case RE_WORD_END:
    case RE_WORD_BOUNDARY:
    case RE_NON_WORD_BOUNDARY:
    case RE_GROUP_ENTER:
    case RE_GROUP_EXIT:
    case RE_ASSERT_POS:
    case RE_ASSERT_NEG:
    case RE_ASSERT_BACKPOS:
    case RE_ASSERT_BACKNEG:
    case RE_ZERO_VAR:
      break;
    case RE_GROUP_MATCH:
      iVar4 = regex_scan_frame::is_recursing(&local_48);
      if (iVar4 == 0) {
        iVar6 = 0;
        iVar4 = this->next_state_;
        if (this->next_state_ < 1) {
          iVar4 = 0;
        }
        paVar8 = &this->tuple_arr_->info;
        final_00 = -1;
        init_00 = -1;
        for (; iVar4 != iVar6; iVar6 = iVar6 + 1) {
          wVar1 = ((re_tuple *)((long)paVar8 + -8))->typ;
          if (wVar1 == L'\x12') {
            if (paVar8->ch == prVar2[init].info.ch) {
              final_00 = iVar6;
            }
          }
          else if ((wVar1 == L'\x11') && (paVar8->ch == prVar2[init].info.ch)) {
            init_00 = iVar6;
          }
          paVar8 = (anon_union_16_5_eb0a944d_for_info *)((long)paVar8 + 0x28);
        }
        if ((-1 < init_00) && (-1 < final_00)) {
          get_match_length(this,init_00,final_00,&gmin,&gmax,&local_48);
          uVar5 = *local_50 + gmin;
          if ((int)(*local_50 | gmin) < 0) {
            uVar5 = 0xffffffff;
          }
          *local_50 = uVar5;
          uVar5 = *local_58 + gmax;
          if ((int)(*local_58 | gmax) < 0) {
            uVar5 = 0xffffffff;
          }
          *local_58 = uVar5;
        }
      }
      else {
        *local_58 = 0xffffffff;
      }
      break;
    case RE_LOOP_BRANCH:
      iVar4 = regex_scan_frame::is_recursing(&local_48);
      uVar5 = 0xffffffff;
      if (iVar4 == 0) {
        get_match_length(this,prVar2[init].next_state_1,init,&gmin,&gmax,&local_48);
        uVar5 = prVar2[init].info.ch * gmin;
        if ((prVar2[init].info.ch | gmin) < 0) {
          uVar5 = 0xffffffff;
        }
        uVar7 = uVar5 + *local_50;
        if ((int)(uVar5 | *local_50) < 0) {
          uVar7 = 0xffffffff;
        }
        *local_50 = uVar7;
        uVar5 = prVar2[init].info.sub.final;
        uVar7 = uVar5 * gmax;
        if ((int)(uVar5 | gmax) < 0) {
          uVar7 = 0xffffffff;
        }
        uVar5 = uVar7 + *local_58;
        if ((int)(uVar7 | *local_58) < 0) {
          uVar5 = 0xffffffff;
        }
      }
      *local_58 = uVar5;
      lStack_70 = 0x1c;
    }
    init = *(int *)((long)&prVar2[init].typ + lStack_70);
  } while( true );
}

Assistant:

void CRegexParser::get_match_length(re_state_id init, re_state_id final,
                                    int *minlen, int *maxlen,
                                    regex_scan_frame *stack)
{
    /* set up a stack frame in case we need to recurse */
    regex_scan_frame fr(stack);

    /* start with zero lengths */
    *minlen = *maxlen = 0;

    /* iterate through the machine */
    for (re_state_id i = init ; i != final ; )
    {
        /* remember the current state in our stack frame */
        fr.st = i;

        /* get this tuple */
        re_tuple *t = &tuple_arr_[i];

        /* mark this state as visited, to detect infinite loops */
        t->flags |= RE_STATE_CYCLE_TEST;

        /* check what we have */
        switch (t->typ)
        {
        case RE_TEXT_BEGIN:
        case RE_TEXT_END:
        case RE_LOOKBACK_POS:
        case RE_WORD_BEGIN:
        case RE_WORD_END:
        case RE_WORD_BOUNDARY:
        case RE_NON_WORD_BOUNDARY:
        case RE_GROUP_ENTER:
        case RE_GROUP_EXIT:
        case RE_ASSERT_POS:
        case RE_ASSERT_NEG:
        case RE_ASSERT_BACKPOS:
        case RE_ASSERT_BACKNEG:
        case RE_ZERO_VAR:
            /* 
             *   assertions, group entries, and loop entries contribute
             *   nothing to the match length - continue to the onward branch 
             */
            i = t->next_state_1;
            break;

        case RE_EPSILON:
            /* 
             *   for single-transition epsilons, simply proceed to the next
             *   state 
             */
            if (t->next_state_2 == RE_STATE_INVALID)
            {
                i = t->next_state_1;
                break;
            }

            /*
             *   Epsilon transitions have two lengths: the length of the
             *   first branch, and the length of the second branch.
             *   Calculate the two branches separately, and take the lower of
             *   the minimum values and the higher of the maximum values.
             *   
             *   Before recursing, check to see if we're looping.  If we've
             *   recursed from the current state already in this search,
             *   we're in a loop, so we have a maximum length of infinity.  
             */
            if (fr.is_recursing())
            {
                /* we're looping, so we have an unbounded maximum length */
                *maxlen = -1;
            }
            else
            {
                /* 
                 *   we're not looping yet, so we can recursively calculate
                 *   the length of each sub-branch 
                 */
                int min1, min2, max1, max2;
                get_match_length(t->next_state_1, final, &min1, &max1, &fr);
                get_match_length(t->next_state_2, final, &min2, &max2, &fr);
                
                /* add the lower min and the higher max to the total */
                gml_add(minlen, gml_min(min1, min2));
                gml_add(maxlen, gml_max(max1, max2));
            }

            /* we've fully considered both branches, so we're done */
            return;

        case RE_LOOP_BRANCH:
            /*
             *   A loop branch contributes (min..max) * the length of the
             *   "enter" branch (the first epsilon transition).  Check that
             *   we're not recursing first; if so, we have an unbounded
             *   maximum length.  
             */
            if (fr.is_recursing())
            {
                /* looping - the maximum is unbounded */
                *maxlen = -1;
            }
            else
            {
                /* 
                 *   Calculate the length of the loop branch.  Note that the
                 *   loop ends at the current state. 
                 */
                int loopmin, loopmax;
                get_match_length(t->next_state_1, i, &loopmin, &loopmax, &fr);

                /* add the loop min and max to the running total */
                gml_add(minlen, gml_mul(loopmin, t->info.loop.loop_min));
                gml_add(maxlen, gml_mul(loopmax, t->info.loop.loop_max));
            }

            /* continue from the post-loop state */
            i = t->next_state_2;
            break;

        case RE_GROUP_MATCH:
            /*
             *   A group matcher matches the same length as its corresponding
             *   group.  Find the group entry state, then measure its length
             *   and use it as the result.
             *   
             *   As usual, before recursively calculating the group length,
             *   we need to make sure we're not recursing from the current
             *   state.  
             */
            if (fr.is_recursing())
            {
                /* looping, so the length of this branch is unbounded */
                *maxlen = -1;
            }
            else
            {
                /* locate the enter/exit states for the group */
                re_state_id g, genter, gexit;
                re_tuple *gt;
                for (g = 0, gt = tuple_arr_, genter = gexit = -1 ;
                     g < next_state_ ; ++g, ++gt)
                {
                    if (gt->typ == RE_GROUP_ENTER
                        && gt->info.ch == t->info.ch)
                        genter = g;
                    else if (gt->typ == RE_GROUP_EXIT
                             && gt->info.ch == t->info.ch)
                        gexit = g;
                }

                /* if we found the group, figure its length */
                if (genter >= 0 && gexit >= 0)
                {
                    /* figure the group length range */
                    int gmin, gmax;
                    get_match_length(genter, gexit, &gmin, &gmax, &fr);

                    /* add the group min and max to the running totals */
                    gml_add(minlen, gmin);
                    gml_add(maxlen, gmax);
                }
            }

            /* move on to the next state */
            i = t->next_state_1;
            break;
        
        default:
            /* everything else matches a single character */
            gml_add(minlen, 1);
            gml_add(maxlen, 1);

            /* on to the next state */
            i = t->next_state_1;
            break;
        }
    }
}